

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  _Bool _Var2;
  char *pcVar3;
  __int32_t **pp_Var4;
  char letter;
  uint uVar5;
  char *__s;
  char *pcVar6;
  char cVar7;
  char word_b [1024];
  char word_a [1024];
  
  pcVar6 = word_b;
  puts("Tell me two words and I will tell you their letters in common!");
  __s = word_a;
  do {
    printf("> ");
    pcVar3 = fgets(__s,0x400,_stdin);
    if (pcVar3 == (char *)0x0) {
      return 1;
    }
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    pcVar3 = fgets(word_b,0x400,_stdin);
    if (pcVar3 == (char *)0x0) {
      return 1;
    }
  } while (word_b[0] == '\n');
  for (; cVar1 = *__s, cVar7 = word_b[0], (long)cVar1 != 0; __s = __s + 1) {
    pp_Var4 = __ctype_toupper_loc();
    *__s = (char)(*pp_Var4)[cVar1];
  }
  while (cVar7 != '\0') {
    pp_Var4 = __ctype_toupper_loc();
    *pcVar6 = (char)(*pp_Var4)[cVar7];
    cVar7 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
  }
  printf("These two words have in common the following letters: ");
  for (uVar5 = 0x41; uVar5 != 0x5b; uVar5 = uVar5 + 1) {
    _Var2 = is_present((char)uVar5,word_a);
    if ((_Var2) && (_Var2 = is_present((char)uVar5,word_b), _Var2)) {
      printf("%c ",(ulong)uVar5);
    }
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word_a[1024];
  char word_b[1024];
  printf("Tell me two words and I will tell you their letters in common!\n");

  do {
    printf("> ");
    if (fgets(word_a, sizeof word_a, stdin) == NULL) return 1;
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    if (fgets(word_b, sizeof word_b, stdin) == NULL) return 1;
  } while (word_b[0] == '\n');

  // Compact toupper, cf. 13.1
  for (size_t n = 0; word_a[n]; n++) word_a[n] = (char)toupper(word_a[n]);
  for (size_t n = 0; word_b[n]; n++) word_b[n] = (char)toupper(word_b[n]);

  printf("These two words have in common the following letters: ");
  for (char letter = 'A'; letter <= 'Z'; letter++) {
    if (is_present(letter, word_a) && is_present(letter, word_b)) {
      printf("%c ", letter);
    }
  }
  printf("\n");
  return 0;
}